

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O0

void duckdb::ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)4>
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ParquetMetaDataOperatorData *pPVar1;
  ulong uVar2;
  MultiFileList *pMVar3;
  idx_t iVar4;
  DataChunk *in_RDX;
  ParquetBloomProbeBindData *bloom_probe_bind_data;
  ParquetMetaDataBindData *bind_data;
  ParquetMetaDataOperatorData *data;
  Value *in_stack_000003a8;
  string *in_stack_000003b0;
  OpenFileInfo *in_stack_000003b8;
  vector<duckdb::LogicalType,_true> *in_stack_000003c0;
  ClientContext *in_stack_000003c8;
  ParquetMetaDataOperatorData *in_stack_000003d0;
  ParquetBloomProbeBindData *in_stack_ffffffffffffffd0;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffffd0);
  pPVar1 = GlobalTableFunctionState::Cast<duckdb::ParquetMetaDataOperatorData>
                     ((GlobalTableFunctionState *)in_stack_ffffffffffffffd0);
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffffd0);
  FunctionData::Cast<duckdb::ParquetMetaDataBindData>((FunctionData *)in_stack_ffffffffffffffd0);
  do {
    while (uVar2 = duckdb::ColumnDataCollection::Scan
                             ((ColumnDataScanState *)&pPVar1->collection,
                              (DataChunk *)&pPVar1->scan_state), (uVar2 & 1) == 0) {
      pMVar3 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                         ((shared_ptr<duckdb::MultiFileList,_true> *)in_stack_ffffffffffffffd0);
      uVar2 = duckdb::MultiFileList::Scan
                        ((MultiFileListScanData *)pMVar3,(OpenFileInfo *)&pPVar1->file_list_scan);
      if ((uVar2 & 1) == 0) {
        return;
      }
      optional_ptr<const_duckdb::FunctionData,_true>::operator->
                ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 =
           FunctionData::Cast<duckdb::ParquetBloomProbeBindData>
                     ((FunctionData *)in_stack_ffffffffffffffd0);
      ParquetMetaDataOperatorData::ExecuteBloomProbe
                (in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                 in_stack_000003b0,in_stack_000003a8);
    }
    iVar4 = DataChunk::size(in_RDX);
  } while (iVar4 == 0);
  return;
}

Assistant:

void ParquetMetaDataImplementation(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<ParquetMetaDataOperatorData>();
	auto &bind_data = data_p.bind_data->Cast<ParquetMetaDataBindData>();

	while (true) {
		if (!data.collection.Scan(data.scan_state, output)) {

			// Try get next file
			if (!bind_data.file_list->Scan(data.file_list_scan, data.current_file)) {
				return;
			}

			switch (TYPE) {
			case ParquetMetadataOperatorType::SCHEMA:
				data.LoadSchemaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::META_DATA:
				data.LoadRowGroupMetadata(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
				data.LoadKeyValueMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::FILE_META_DATA:
				data.LoadFileMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::BLOOM_PROBE: {
				auto &bloom_probe_bind_data = data_p.bind_data->Cast<ParquetBloomProbeBindData>();
				data.ExecuteBloomProbe(context, bind_data.return_types, data.current_file,
				                       bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
				break;
			}
			default:
				throw InternalException("Unsupported ParquetMetadataOperatorType");
			}
			continue;
		}
		if (output.size() != 0) {
			return;
		}
	}
}